

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_algebra.c
# Opt level: O1

void la_dgemv_noe(int m,int n,double alpha,double *a,int lda,double *x,int incx,double beta,
                 double *y,int incy,double *z,int incz)

{
  double *pdVar1;
  int j;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  
  if (a == (double *)0x0) {
    __assert_fail("a",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xd5,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (x == (double *)0x0) {
    __assert_fail("x",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xd6,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (y == (double *)0x0) {
    __assert_fail("y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xd7,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (z == (double *)0x0) {
    __assert_fail("z",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xd8,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (x == z) {
    __assert_fail("x != z",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xd9,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (x == y) {
    __assert_fail("x != y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xda,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if ((lda < 1) || (lda < n)) {
    __assert_fail("lda >= 1 && lda >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xdb,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (incx < 1) {
    __assert_fail("incx > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xdc,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  if (0 < incy) {
    if (0 < incz) {
      if (0 < n) {
        uVar3 = 0;
        do {
          dVar4 = y[uVar3 * (uint)incy] * beta;
          if (0 < m) {
            uVar2 = 0;
            pdVar1 = x;
            do {
              dVar4 = dVar4 + a[uVar2] * alpha * *pdVar1;
              uVar2 = uVar2 + 1;
              pdVar1 = pdVar1 + (uint)incx;
            } while ((uint)m != uVar2);
          }
          z[uVar3 * (uint)incz] = dVar4;
          uVar3 = uVar3 + 1;
          a = a + (uint)lda;
        } while (uVar3 != (uint)n);
      }
      return;
    }
    __assert_fail("incz > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                  ,0xde,
                  "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
                 );
  }
  __assert_fail("incy > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/linear_algebra.c"
                ,0xdd,
                "void la_dgemv_noe(int, int, double, const double *, int, const double *, int, double, const double *, int, double *, int)"
               );
}

Assistant:

void la_dgemv_noe(
        int m, int n,
        double alpha,
        const double *a, int lda,
        const double *x, int incx,
        double beta,
        const double *y, int incy,
        double *z, int incz)
{
    assert(a);
    assert(x);
    assert(y);
    assert(z);
    assert(x != z);
    assert(x != y);
    assert(lda >= 1 && lda >= n);
    assert(incx > 0);
    assert(incy > 0);
    assert(incz > 0);

    for (int i = 0; i < n; i++) {
        double zi = beta * y[i * incy];
        for (int j = 0; j < m; j++) {
            zi += alpha * a[i * lda + j] * x[j * incx];
        }
        z[i * incz] = zi;
    }
}